

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O2

Error * ot::commissioner::PathExists(Error *__return_storage_ptr__,string *path)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string sStack_78;
  format_string_checker<char> local_58;
  
  iVar1 = access((path->_M_dataplus)._M_p,0);
  if (iVar1 == 0) {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    puVar2 = (uint *)__errno_location();
    if (*puVar2 == 0x14) {
      local_58.types_[0] = string_type;
      local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "{} path is not a directory";
      local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1a;
      local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_58.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_58.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      pcVar3 = "{} path is not a directory";
      local_58.context_.types_ = local_58.types_;
      while (pcVar4 = pcVar3, pcVar4 != "") {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) goto LAB_001b75de;
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar4,"",&local_58);
        }
      }
      local_58._0_8_ = (path->_M_dataplus)._M_p;
      local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)path->_M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1a;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_(&sStack_78,(v10 *)"{} path is not a directory",fmt_00,args_00);
      __return_storage_ptr__->mCode = kNotFound;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&sStack_78)
      ;
    }
    else if (*puVar2 == 2) {
      local_58.types_[0] = string_type;
      local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "{} path does not exist";
      local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x16;
      local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_58.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_58.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      pcVar3 = "{} path does not exist";
      local_58.context_.types_ = local_58.types_;
      while (pcVar4 = pcVar3, pcVar4 != "") {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) {
LAB_001b75de:
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar4,"",&local_58);
        }
      }
      local_58._0_8_ = (path->_M_dataplus)._M_p;
      local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)path->_M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x16;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_(&sStack_78,(v10 *)"{} path does not exist",fmt,args);
      __return_storage_ptr__->mCode = kNotFound;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&sStack_78)
      ;
    }
    else {
      local_58.types_[0] = int_type;
      local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "path error, errno = {}";
      local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x16;
      local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_58.context_.super_basic_format_parse_context<char>._20_4_ = 1;
      local_58.parse_funcs_[0] =
           ::fmt::v10::detail::parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar3 = "path error, errno = {}";
      local_58.context_.types_ = local_58.types_;
      while (pcVar4 = pcVar3, pcVar4 != "") {
        pcVar3 = pcVar4 + 1;
        if (*pcVar4 == '}') {
          if ((pcVar3 == "") || (*pcVar3 != '}')) goto LAB_001b75de;
          pcVar3 = pcVar4 + 2;
        }
        else if (*pcVar4 == '{') {
          pcVar3 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                             (pcVar4,"",&local_58);
        }
      }
      local_58._0_8_ = ZEXT48(*puVar2);
      fmt_01.size_ = 1;
      fmt_01.data_ = (char *)0x16;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v10::vformat_abi_cxx11_(&sStack_78,(v10 *)"path error, errno = {}",fmt_01,args_01);
      __return_storage_ptr__->mCode = kNotFound;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->mMessage,(string *)&sStack_78)
      ;
    }
    std::__cxx11::string::~string((string *)&sStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

Error PathExists(std::string path)
{
    int err = access(path.c_str(), F_OK);
    if (err != 0)
    {
        switch (errno)
        {
        case ENOENT:
            return ERROR_NOT_FOUND("{} path does not exist", path);
        case ENOTDIR:
            return ERROR_NOT_FOUND("{} path is not a directory", path);
        default:
            return ERROR_NOT_FOUND("path error, errno = {}", errno);
        }
    }
    return ERROR_NONE;
}